

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O1

void deqp::gles31::Functional::anon_unknown_0::generateUniformBlockArrayStrideContents
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  NodeType NVar1;
  TestNode *pTVar2;
  Node *pNVar3;
  SharedPtrStateBase *pSVar4;
  deInt32 *pdVar5;
  bool bVar6;
  ProgramResourceQueryTestTarget queryTarget;
  SharedPtr layout;
  ProgramResourceQueryTestTarget local_60;
  SharedPtr local_58;
  _func_int **local_44 [2];
  MatrixOrder local_34;
  
  bVar6 = false;
  ProgramResourceQueryTestTarget::ProgramResourceQueryTestTarget
            (&local_60,PROGRAMINTERFACE_UNIFORM,4);
  pNVar3 = parentStructure->m_ptr;
  NVar1 = pNVar3->m_type;
  if (NVar1 == TYPE_INTERFACE_BLOCK) {
    if (*(char *)&pNVar3[1]._vptr_Node == '\x01') {
      bVar6 = ((pNVar3->m_enclosingNode).m_ptr)->m_type != TYPE_ARRAY_ELEMENT;
    }
    else {
      bVar6 = false;
    }
  }
  if ((NVar1 != TYPE_INTERFACE_BLOCK) || (bVar6)) {
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)pTVar2,context->m_testCtx,"types","Types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar2);
    generateVariableCases(context,parentStructure,(TestCaseGroup *)pTVar2,&local_60,2,false);
    generateOpaqueTypeCases(context,parentStructure,(TestCaseGroup *)pTVar2,&local_60,2,false);
    pTVar2 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar2,context->m_testCtx,"aggregates","Aggregate types");
    tcu::TestNode::addChild(&targetGroup->super_TestNode,pTVar2);
    if (NVar1 != TYPE_INTERFACE_BLOCK) {
      generateBufferBackedArrayStrideTypeAggregateCases
                (context,parentStructure,(TestCaseGroup *)pTVar2,local_60.interface,TYPE_SAMPLER_2D,
                 1,false);
      pNVar3 = (Node *)operator_new(0x38);
      glu::Layout::Layout((Layout *)local_44,-1,0,-1,FORMATLAYOUT_LAST,MATRIXORDER_LAST);
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a6ef8;
      pNVar3->m_type = TYPE_LAYOUT_QUALIFIER;
      (pNVar3->m_enclosingNode).m_ptr = parentStructure->m_ptr;
      pSVar4 = parentStructure->m_state;
      (pNVar3->m_enclosingNode).m_state = pSVar4;
      if (pSVar4 != (SharedPtrStateBase *)0x0) {
        LOCK();
        pSVar4->strongRefCount = pSVar4->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar5 = &((pNVar3->m_enclosingNode).m_state)->weakRefCount;
        *pdVar5 = *pdVar5 + 1;
        UNLOCK();
      }
      pNVar3->_vptr_Node = (_func_int **)&PTR__Node_021a7190;
      pNVar3[1]._vptr_Node = local_44[0];
      *(_func_int ***)&pNVar3[1].m_type = local_44[1];
      *(MatrixOrder *)&pNVar3[1].m_enclosingNode.m_ptr = local_34;
      local_58.m_state = (SharedPtrStateBase *)0x0;
      local_58.m_ptr = pNVar3;
      pSVar4 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar4->strongRefCount = 0;
      pSVar4->weakRefCount = 0;
      pSVar4->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_021a6f18;
      pSVar4[1]._vptr_SharedPtrStateBase = (_func_int **)pNVar3;
      pSVar4->strongRefCount = 1;
      pSVar4->weakRefCount = 1;
      local_58.m_state = pSVar4;
      generateBufferBackedArrayStrideTypeAggregateCases
                (context,&local_58,(TestCaseGroup *)pTVar2,local_60.interface,
                 TYPE_UINT_ATOMIC_COUNTER,1,false);
      pdVar5 = &pSVar4->strongRefCount;
      LOCK();
      *pdVar5 = *pdVar5 + -1;
      UNLOCK();
      if (*pdVar5 == 0) {
        local_58.m_ptr = (Node *)0x0;
        (*(local_58.m_state)->_vptr_SharedPtrStateBase[2])();
      }
      LOCK();
      pdVar5 = &(local_58.m_state)->weakRefCount;
      *pdVar5 = *pdVar5 + -1;
      UNLOCK();
      if (*pdVar5 == 0) {
        if (local_58.m_state != (SharedPtrStateBase *)0x0) {
          (*(local_58.m_state)->_vptr_SharedPtrStateBase[1])();
        }
        local_58.m_state = (SharedPtrStateBase *)0x0;
      }
    }
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)pTVar2,local_60.interface,TYPE_FLOAT,2,false
              );
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)pTVar2,local_60.interface,TYPE_BOOL,1,false)
    ;
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)pTVar2,local_60.interface,TYPE_BOOL_VEC3,2,
               false);
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)pTVar2,local_60.interface,TYPE_FLOAT_VEC3,2,
               false);
    generateBufferBackedArrayStrideTypeAggregateCases
              (context,parentStructure,(TestCaseGroup *)pTVar2,local_60.interface,TYPE_INT_VEC3,2,
               false);
  }
  else {
    generateVariableCases(context,parentStructure,targetGroup,&local_60,1,true);
    generateVariableArrayCases(context,parentStructure,targetGroup,&local_60,1);
    generateCompoundVariableCases(context,parentStructure,targetGroup,&local_60,1);
  }
  return;
}

Assistant:

static void generateUniformBlockArrayStrideContents (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* const targetGroup)
{
	const ProgramResourceQueryTestTarget	queryTarget			(PROGRAMINTERFACE_UNIFORM, PROGRAMRESOURCEPROP_ARRAY_STRIDE);
	const bool								isInterfaceBlock	= (parentStructure->getType() == ResourceDefinition::Node::TYPE_INTERFACE_BLOCK);
	const bool								namedNonArrayBlock	= isInterfaceBlock																					&&
																  static_cast<const ResourceDefinition::InterfaceBlock*>(parentStructure.get())->m_named			&&
																  parentStructure->getEnclosingNode()->getType() != ResourceDefinition::Node::TYPE_ARRAY_ELEMENT;

	if (!isInterfaceBlock || namedNonArrayBlock)
	{
		// .types
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "types", "Types");
			targetGroup->addChild(blockGroup);

			generateVariableCases(context, parentStructure, blockGroup, queryTarget, 2, false);
			generateOpaqueTypeCases(context, parentStructure, blockGroup, queryTarget, 2, false);
		}

		// .aggregates
		{
			tcu::TestCaseGroup* const blockGroup = new tcu::TestCaseGroup(context.getTestContext(), "aggregates", "Aggregate types");
			targetGroup->addChild(blockGroup);

			// .sampler_2d_*
			if (!isInterfaceBlock)
				generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_SAMPLER_2D, 1, false);

			// .atomic_counter_*
			if (!isInterfaceBlock)
			{
				const ResourceDefinition::Node::SharedPtr layout(new ResourceDefinition::LayoutQualifier(parentStructure, glu::Layout(-1, 0)));
				generateBufferBackedArrayStrideTypeAggregateCases(context, layout, blockGroup, queryTarget.interface, glu::TYPE_UINT_ATOMIC_COUNTER, 1, false);
			}

			// .float_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_FLOAT, 2, false);

			// .bool_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_BOOL, 1, false);

			// .bvec3_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_BOOL_VEC3, 2, false);

			// .vec3_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_FLOAT_VEC3, 2, false);

			// .ivec2_*
			generateBufferBackedArrayStrideTypeAggregateCases(context, parentStructure, blockGroup, queryTarget.interface, glu::TYPE_INT_VEC3, 2, false);
		}
	}
	else
	{
		generateVariableCases(context, parentStructure, targetGroup, queryTarget, 1);
		generateVariableArrayCases(context, parentStructure, targetGroup, queryTarget, 1);
		generateCompoundVariableCases(context, parentStructure, targetGroup, queryTarget, 1);
	}
}